

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_color.cpp
# Opt level: O1

void __thiscall ON_Color::ON_Color(ON_Color *this,int r,int g,int b)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  int iVar4;
  
  if (0xfe < r) {
    r = 0xff;
  }
  uVar2 = (uchar)r;
  if (r < 1) {
    uVar2 = '\0';
  }
  if (0xfe < g) {
    g = 0xff;
  }
  uVar1 = (uchar)g;
  if (g < 1) {
    uVar1 = '\0';
  }
  iVar4 = 0xff;
  if (b < 0xff) {
    iVar4 = b;
  }
  (this->field_0).m_color = 0;
  uVar3 = (uchar)iVar4;
  if (iVar4 < 1) {
    uVar3 = '\0';
  }
  (this->field_0).m_RGBA[0] = uVar2;
  (this->field_0).m_RGBA[1] = uVar1;
  (this->field_0).m_RGBA[2] = uVar3;
  (this->field_0).m_RGBA[3] = '\0';
  return;
}

Assistant:

ON_Color::ON_Color(int r, int g, int b)
{
  SetRGB(r,g,b);
}